

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FArrayBox.cpp
# Opt level: O1

void amrex::FArrayBox::setFormat(Format fmt)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  RealDescriptor *pRVar4;
  undefined4 extraout_var_00;
  ostream *this;
  undefined4 extraout_var_01;
  undefined **ppuVar5;
  void *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  __fn *in_RSI;
  void *in_R8;
  undefined4 extraout_var;
  
  iVar1 = 0x79e6d8;
  switch(fmt) {
  case FAB_ASCII:
    puVar3 = (undefined8 *)operator_new(8);
    ppuVar5 = &PTR__FABio_00838e58;
    goto LAB_0056ecd5;
  case FAB_IEEE:
  case FAB_IEEE_32:
    puVar3 = (undefined8 *)operator_new(0x10);
    pRVar4 = FPC::Ieee32NormalRealDescriptor();
    iVar1 = RealDescriptor::clone(pRVar4,in_RSI,__child_stack,iVar1,in_R8);
    uVar2 = CONCAT44(extraout_var,iVar1);
    break;
  case FAB_NATIVE:
    puVar3 = (undefined8 *)operator_new(0x10);
    pRVar4 = FPC::NativeRealDescriptor();
    iVar1 = RealDescriptor::clone(pRVar4,in_RSI,__child_stack_01,iVar1,in_R8);
    uVar2 = CONCAT44(extraout_var_01,iVar1);
    break;
  default:
    this = ErrorStream();
    std::__ostream_insert<char,std::char_traits<char>>
              (this,"FArrayBox::setFormat(): Bad FABio::Format = ",0x2c);
    std::ostream::operator<<(this,fmt);
    puVar3 = (undefined8 *)0x0;
    Abort_host((char *)0x0);
    goto LAB_0056ecd8;
  case FAB_8BIT:
    puVar3 = (undefined8 *)operator_new(8);
    ppuVar5 = &PTR__FABio_00838f10;
LAB_0056ecd5:
    *puVar3 = ppuVar5;
    goto LAB_0056ecd8;
  case FAB_NATIVE_32:
    puVar3 = (undefined8 *)operator_new(0x10);
    pRVar4 = FPC::Native32RealDescriptor();
    iVar1 = RealDescriptor::clone(pRVar4,in_RSI,__child_stack_00,iVar1,in_R8);
    uVar2 = CONCAT44(extraout_var_00,iVar1);
  }
  *puVar3 = &PTR__FABio_binary_00838e10;
  puVar3[1] = uVar2;
LAB_0056ecd8:
  format = fmt;
  if (fabio != (long *)0x0) {
    (**(code **)(*fabio + 8))();
  }
  fabio = puVar3;
  return;
}

Assistant:

void
FArrayBox::setFormat (FABio::Format fmt)
{
    FABio* fio = 0;

    switch (fmt)
    {
    case FABio::FAB_ASCII:
        fio = new FABio_ascii;
        break;
    case FABio::FAB_8BIT:
        fio = new FABio_8bit;
        break;
    case FABio::FAB_NATIVE:
        fio = new FABio_binary(FPC::NativeRealDescriptor().clone());
        break;
    case FABio::FAB_IEEE:
        //amrex::Warning("FABio::FAB_IEEE has been deprecated");
        //
        // Fall through ...
        //
    case FABio::FAB_IEEE_32:
        fio = new FABio_binary(FPC::Ieee32NormalRealDescriptor().clone());
        break;
    case FABio::FAB_NATIVE_32:
        fio = new FABio_binary(FPC::Native32RealDescriptor().clone());
        break;
    default:
        amrex::ErrorStream() << "FArrayBox::setFormat(): Bad FABio::Format = " << fmt;
        amrex::Abort();
    }

    FArrayBox::format = fmt;

    setFABio(fio);
}